

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

sexp_conflict
sexp_getgrgid_safe_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  gid_t gid;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict res4;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  group **tmp4;
  group *tmp1;
  int err;
  group **in_stack_ffffffffffffff60;
  group **buflen;
  char *buf;
  group *grp;
  char local_80 [4];
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  sexp_conflict *local_60;
  undefined8 local_58;
  sexp_conflict local_50;
  void *local_48;
  void *local_40;
  int local_34;
  int *local_30;
  int *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_34 = 0;
  local_50 = (sexp_conflict)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_60,0,0x10);
  local_68 = 0x43e;
  memset(&local_78,0,0x10);
  _local_80 = 0x43e;
  memset(&stack0xffffffffffffff70,0,0x10);
  if ((((ulong)local_28 & 1) == 1) || ((((ulong)local_28 & 3) == 0 && (*local_28 == 0xc)))) {
    if ((((ulong)local_30 & 3) == 0) && (*local_30 == 9)) {
      local_60 = &local_50;
      local_58 = *(undefined8 *)(local_10 + 0x6080);
      *(sexp_conflict ***)(local_10 + 0x6080) = &local_60;
      local_78 = &local_68;
      local_70 = *(undefined8 *)(local_10 + 0x6080);
      *(undefined8 ***)(local_10 + 0x6080) = &local_78;
      buf = local_80;
      grp = *(group **)(local_10 + 0x6080);
      *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff70;
      local_40 = calloc(1,0x21);
      local_48 = calloc(1,9);
      uVar5 = _local_80;
      if (((ulong)local_28 & 1) == 1) {
        auVar2._8_8_ = (long)local_28 >> 0x3f;
        auVar2._0_8_ = (ulong)local_28 & 0xfffffffffffffffe;
        buflen = SUB168(auVar2 / SEXT816(2),0);
      }
      else if ((((ulong)local_28 & 3) == 0) && (*local_28 == 0xc)) {
        in_stack_ffffffffffffff60 = *(group ***)(local_28 + 6);
        buflen = in_stack_ffffffffffffff60;
      }
      else {
        in_stack_ffffffffffffff60 = (group **)0x0;
        buflen = in_stack_ffffffffffffff60;
      }
      uVar1 = (ulong)_local_80 >> 0x20;
      gid = (gid_t)uVar1;
      _local_80 = uVar5;
      local_34 = getgrgid_safe(gid,grp,buf,(size_t)buflen,in_stack_ffffffffffffff60);
      if (local_34 == 0) {
        auVar3._8_8_ = (long)*(ulong *)(local_18 + 0x38) >> 0x3f;
        auVar3._0_8_ = *(ulong *)(local_18 + 0x38) & 0xfffffffffffffffe;
        local_68 = sexp_make_cpointer(local_10,SUB168(auVar3 / SEXT816(2),0),local_40,local_30,1);
        uVar1 = *(ulong *)(*(long *)(local_18 + 0x48) + 0x18);
        auVar4._8_8_ = (long)uVar1 >> 0x3f;
        auVar4._0_8_ = uVar1 & 0xfffffffffffffffe;
        _local_80 = sexp_make_cpointer(local_10,SUB168(auVar4 / SEXT816(2),0),local_48,0x3e,1);
        local_50 = (sexp_conflict)0x23e;
        sexp_push_op(local_10,&local_50,_local_80);
        sexp_push_op(local_10,&local_50,local_68);
      }
      else {
        local_50 = (sexp_conflict)0x3e;
      }
      *(undefined8 *)(local_10 + 0x6080) = local_58;
      local_8 = local_50;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,9,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,2,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_getgrgid_safe_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  struct group* tmp1;
  struct group* *tmp4;
  sexp_gc_var3(res, res1, res4);
  if (! sexp_exact_integerp(arg0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg0);
  if (! sexp_stringp(arg2))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg2);
  sexp_gc_preserve3(ctx, res, res1, res4);
  tmp1 = (struct group*) calloc(1, 1 + sizeof(tmp1[0]));
  tmp4 = (struct group**) calloc(1, 1 + sizeof(tmp4[0]));
  err = getgrgid_safe(sexp_uint_value(arg0), tmp1, sexp_string_data(arg2), sexp_string_size(arg2), tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, arg2, 1);
  res4 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ONE)), tmp4, SEXP_FALSE, 1);
  res = SEXP_NULL;
  sexp_push(ctx, res, res4);
  sexp_push(ctx, res, res1);
  }
  sexp_gc_release3(ctx);
  return res;
}